

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Int_t * Vec_WecInsertLevel(Vec_Wec_t *p,int i)

{
  int iVar1;
  Vec_Int_t *local_20;
  Vec_Int_t *pTemp;
  int i_local;
  Vec_Wec_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_WecGrow(p,0x10);
    }
    else {
      Vec_WecGrow(p,p->nCap << 1);
    }
  }
  p->nSize = p->nSize + 1;
  if ((-1 < i) && (i < p->nSize)) {
    for (local_20 = p->pArray + (long)p->nSize + -2; p->pArray + i <= local_20;
        local_20 = local_20 + -1) {
      iVar1 = local_20->nSize;
      local_20[1].nCap = local_20->nCap;
      local_20[1].nSize = iVar1;
      local_20[1].pArray = local_20->pArray;
    }
    Vec_IntZero(p->pArray + i);
    return p->pArray + i;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x142,"Vec_Int_t *Vec_WecInsertLevel(Vec_Wec_t *, int)");
}

Assistant:

static inline Vec_Int_t * Vec_WecInsertLevel( Vec_Wec_t * p, int i )
{
    Vec_Int_t * pTemp;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    assert( i >= 0 && i < p->nSize );
    for ( pTemp = p->pArray + p->nSize - 2; pTemp >= p->pArray + i; pTemp-- )
        pTemp[1] = pTemp[0];
    Vec_IntZero( p->pArray + i );
    return p->pArray + i;
}